

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O3

ssize_t mem_read(hFILE *fpv,void *buffer,size_t nbytes)

{
  ulong __n;
  
  __n = (long)fpv[1].begin - (long)fpv[1].end;
  if (nbytes <= __n) {
    __n = nbytes;
  }
  memcpy(buffer,fpv[1].end + (long)fpv[1].buffer,__n);
  fpv[1].end = fpv[1].end + __n;
  return __n;
}

Assistant:

static ssize_t mem_read(hFILE *fpv, void *buffer, size_t nbytes)
{
    hFILE_mem *fp = (hFILE_mem *) fpv;
    size_t avail = fp->length - fp->pos;
    if (nbytes > avail) nbytes = avail;
    memcpy(buffer, fp->buffer + fp->pos, nbytes);
    fp->pos += nbytes;
    return nbytes;
}